

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O2

void __thiscall
QGridLayout::addLayout(QGridLayout *this,QLayout *layout,int row,int column,Alignment alignment)

{
  QGridLayoutPrivate *this_00;
  bool bVar1;
  QGridBox *this_01;
  QLayoutItem *pQVar2;
  
  this_00 = *(QGridLayoutPrivate **)&(this->super_QLayout).field_0x8;
  bVar1 = QLayoutPrivate::checkLayout(&this_00->super_QLayoutPrivate,layout);
  if (bVar1) {
    bVar1 = QLayout::adoptLayout(&this->super_QLayout,layout);
    if (bVar1) {
      this_01 = (QGridBox *)operator_new(0x18);
      pQVar2 = &layout->super_QLayoutItem;
      if (layout == (QLayout *)0x0) {
        pQVar2 = (QLayoutItem *)0x0;
      }
      this_01->item_ = pQVar2;
      QGridBox::setAlignment(this_01,alignment);
      QGridLayoutPrivate::add(this_00,this_01,row,column);
      return;
    }
  }
  return;
}

Assistant:

void QGridLayout::addLayout(QLayout *layout, int row, int column, Qt::Alignment alignment)
{
    Q_D(QGridLayout);
    if (!d->checkLayout(layout))
        return;
    if (!adoptLayout(layout))
        return;
    QGridBox *b = new QGridBox(layout);
    b->setAlignment(alignment);
    d->add(b, row, column);
}